

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O1

void basic_suite::test_null(void)

{
  writer writer;
  ostringstream result;
  undefined4 local_1dc;
  long *local_1d8 [2];
  long local_1c8 [2];
  type local_1b8;
  void *local_1a0;
  long local_190;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_writer<char,16ul>::basic_writer<std::__cxx11::ostringstream>
            ((basic_writer<char,16ul> *)&local_1b8.__align,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1d8[0] = (long *)trial::protocol::json::basic_writer<char,_16UL>::null_value
                                   ((basic_writer<char,_16UL> *)&local_1b8.__align);
  local_1dc = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value<token::null>()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x25,"void basic_suite::test_null()",local_1d8,&local_1dc);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[5]>
            ("result.str()","\"null\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0x26,"void basic_suite::test_null()",local_1d8,"null");
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (local_1a0 != (void *)0x0) {
    operator_delete(local_1a0,local_190 - (long)local_1a0);
  }
  (**(code **)local_1b8._0_8_)();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_null()
{
    std::ostringstream result;
    json::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value<token::null>(), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "null");
}